

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_AddSignConfidentialTx_Test::TestBody
          (cfdcapi_elements_transaction_AddSignConfidentialTx_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_R9;
  bool in_stack_00000087;
  char *in_stack_00000088;
  int in_stack_00000090;
  uint32_t in_stack_00000094;
  char *in_stack_00000098;
  char *in_stack_000000a0;
  void *in_stack_000000a8;
  char *in_stack_000000c0;
  int64_t in_stack_000000c8;
  char *in_stack_000000d0;
  int in_stack_000000d8;
  char **in_stack_000000e8;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  char *str_buffer;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  char *stack;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  uint32_t count;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *signature;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *tx_string2;
  char *tx_string;
  char *sighash;
  int64_t satoshi;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffb78;
  AssertionResult *in_stack_fffffffffffffb80;
  char **rhs;
  CfdErrorCode *in_stack_fffffffffffffb88;
  CfdErrorCode *lhs;
  char *in_stack_fffffffffffffb90;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffb9c;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  AssertionResult *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined4 local_2cc;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  char *in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd63;
  uint32_t in_stack_fffffffffffffd64;
  AssertHelper in_stack_fffffffffffffd68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  AssertionResult local_280;
  int in_stack_fffffffffffffd90;
  AssertHelper local_268;
  Message local_260;
  char **in_stack_fffffffffffffda8;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  AssertionResult local_230;
  char *local_220;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_204;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  undefined4 local_1c4;
  AssertHelper local_1c0;
  Message local_1b8;
  uint32_t *in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffe5c;
  AssertHelper in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined1 clear_stack;
  char *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined1 is_witness;
  uint32_t in_stack_fffffffffffffe84;
  AssertHelper in_stack_fffffffffffffe88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  char **in_stack_fffffffffffffea0;
  AssertHelper local_150;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  AssertionResult local_140;
  AssertHelper local_130;
  Message local_128;
  undefined4 local_11c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef0;
  AssertHelper in_stack_ffffffffffffff00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff08;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  char *local_b8;
  char local_b0 [8];
  char *local_a8;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,(int *)in_stack_fffffffffffffb80);
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffb90 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x348bfa);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x465,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x348c5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x348cb2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(type *)0x348ce6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x466,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x348de2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x348e5d);
  local_a0 = 13000000000000;
  local_a8 = (char *)0x0;
  local_b0[0] = '\0';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  local_b0[4] = '\0';
  local_b0[5] = '\0';
  local_b0[6] = '\0';
  local_b0[7] = '\0';
  local_b8 = (char *)0x0;
  rhs = (char **)0xbd2cc61d000;
  uVar6 = 0;
  pcVar2 = (char *)CONCAT44(uVar5,1);
  lhs = (CfdErrorCode *)0x0;
  local_14 = CfdCreateConfidentialSighash
                       (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094,
                        in_stack_00000090,in_stack_00000088,in_stack_000000c0,in_stack_000000c8,
                        in_stack_000000d0,in_stack_000000d8,in_stack_00000087,in_stack_000000e8);
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(int *)rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x348fa9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x470,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x34900c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x349061);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_f0,
               "\"c90939ef311f105806b401bcfa494921b8df297195fc125ebbd91a018c4066b9\"","sighash",
               "c90939ef311f105806b401bcfa494921b8df297195fc125ebbd91a018c4066b9",local_a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xffffffffffffff08);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x349110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x472,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffff00,(Message *)&stack0xffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff00);
      testing::Message::~Message((Message *)0x349173);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3491cb);
    pcVar3 = (char *)0x0;
    local_14 = CfdCalculateEcSignature
                         (in_stack_fffffffffffffe88.data_,
                          (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          in_stack_fffffffffffffe78,
                          (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                          in_stack_fffffffffffffe6c,SUB41((uint)in_stack_fffffffffffffe68 >> 0x18,0)
                          ,in_stack_fffffffffffffea0);
    clear_stack = (undefined1)((uint)in_stack_fffffffffffffe74 >> 0x18);
    is_witness = (undefined1)((uint)in_stack_fffffffffffffe80 >> 0x18);
    local_11c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(int *)rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffee8);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3492c5);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x479,pcVar4);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      testing::Message::~Message((Message *)0x349328);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34937d);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_140,
                 "\"0268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c2131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea\""
                 ,"signature",
                 "0268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c2131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea"
                 ,pcVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffeb8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34942c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x47c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&stack0xfffffffffffffeb8);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        testing::Message::~Message((Message *)0x34948f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3494e7);
      pcVar2 = local_b0;
      lhs = (CfdErrorCode *)((ulong)lhs & 0xffffffff00000000);
      rhs = (char **)((ulong)rhs & 0xffffffff00000000);
      local_14 = CfdAddConfidentialTxDerSign
                           ((void *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                            (char *)in_stack_fffffffffffffd70.ptr_,
                            (char *)in_stack_fffffffffffffd68.data_,in_stack_fffffffffffffd64,
                            (bool)in_stack_fffffffffffffd63,in_stack_fffffffffffffd58,
                            in_stack_fffffffffffffd90,(bool)in_stack_fffffffffffffd57,
                            (bool)in_stack_fffffffffffffd56,in_stack_fffffffffffffda8);
      in_stack_fffffffffffffe9c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(int *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffea0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffe90);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3495e9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x480,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe88,(Message *)&stack0xfffffffffffffe90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe88);
        testing::Message::~Message((Message *)0x34964c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3496a1);
      CfdFreeStringBuffer((char *)lhs);
    }
    if (local_14 == 0) {
      rhs = &local_b8;
      local_14 = CfdAddConfidentialTxSign
                           ((void *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (char *)in_stack_fffffffffffffe90.ptr_,
                            (char *)in_stack_fffffffffffffe88.data_,in_stack_fffffffffffffe84,
                            (bool)is_witness,in_stack_fffffffffffffe78,(bool)clear_stack,
                            (char **)in_stack_fffffffffffffeb8.ptr_);
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(int *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe78);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffe68);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3497b2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x488,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe60,(Message *)&stack0xfffffffffffffe68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe60);
        testing::Message::~Message((Message *)0x349815);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34986a);
    }
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffe50,
                 "\"0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000\""
                 ,"tx_string2",
                 "0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000"
                 ,local_b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe50);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x34991b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x48b,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        testing::Message::~Message((Message *)0x34997e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3499d6);
      local_1c4 = 0;
      local_14 = CfdGetConfidentialTxInWitnessCount
                           ((void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                            (char *)in_stack_fffffffffffffe60.data_,in_stack_fffffffffffffe5c,
                            in_stack_fffffffffffffe50);
      local_1dc = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(int *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
      if (!bVar1) {
        testing::Message::Message(&local_1e8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x349ab4);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x48f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        testing::Message::~Message((Message *)0x349b17);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x349b6c);
      local_204 = 2;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(uint *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
      if (!bVar1) {
        testing::Message::Message(&local_210);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x349c19);
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x490,pcVar4);
        testing::internal::AssertHelper::operator=(&local_218,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        testing::Message::~Message((Message *)0x349c7c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x349cd4);
      local_220 = (char *)0x0;
      local_14 = CfdGetConfidentialTxInWitness
                           (in_stack_ffffffffffffff08.ptr_,(char *)in_stack_ffffffffffffff00.data_,
                            (uint32_t)((ulong)pcVar3 >> 0x20),(uint32_t)pcVar3,
                            (char **)in_stack_fffffffffffffef0.ptr_);
      local_234 = 0;
      in_stack_fffffffffffffc10 = &local_230;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(int *)rhs);
      in_stack_fffffffffffffc1f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc10);
      if (!(bool)in_stack_fffffffffffffc1f) {
        testing::Message::Message(&local_240);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x349db8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_248,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x494,pcVar3);
        testing::internal::AssertHelper::operator=(&local_248,&local_240);
        testing::internal::AssertHelper::~AssertHelper(&local_248);
        testing::Message::~Message((Message *)0x349e1b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x349e70);
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffda8,
                 "\"03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6\"","stack",
                 "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6",local_220);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffda8);
      if (!bVar1) {
        testing::Message::Message(&local_260);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x349f11);
        testing::internal::AssertHelper::AssertHelper
                  (&local_268,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x495,pcVar3);
        testing::internal::AssertHelper::operator=(&local_268,&local_260);
        testing::internal::AssertHelper::~AssertHelper(&local_268);
        testing::Message::~Message((Message *)0x349f6e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x349fc3);
      if (local_14 == 0) {
        CfdFreeStringBuffer((char *)lhs);
      }
      CfdFreeStringBuffer((char *)lhs);
    }
    CfdFreeStringBuffer((char *)lhs);
  }
  CfdFreeStringBuffer((char *)lhs);
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffbbf,
                                                  in_stack_fffffffffffffbb8));
  if (local_14 != 0) {
    pcVar3 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                          (char **)in_stack_fffffffffffffc10);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(int *)rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd70);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x34a0ee);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x4a6,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd68,(Message *)&stack0xfffffffffffffd70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd68);
      testing::Message::~Message((Message *)0x34a14b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34a1a0);
    testing::internal::CmpHelperSTREQ
              ((internal *)&stack0xfffffffffffffd58,"\"\"","str_buffer","",pcVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd58);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd50);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x34a235);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x4a7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&stack0xfffffffffffffd50);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      testing::Message::~Message((Message *)0x34a292);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34a2e7);
    CfdFreeStringBuffer((char *)lhs);
  }
  local_14 = CfdFreeHandle(lhs);
  local_2cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffb9c,uVar6),pcVar2,lhs,(int *)rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34a3b7);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x4ad,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message((Message *)0x34a414);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34a469);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddSignConfidentialTx) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int64_t satoshi = 13000000000000;
  char* sighash = nullptr;
  char* tx_string = nullptr;
  char* tx_string2 = nullptr;
  ret = CfdCreateConfidentialSighash(
      handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
      kCfdP2wpkh, "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", nullptr,
      satoshi, nullptr, kCfdSigHashAll, false, &sighash);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("c90939ef311f105806b401bcfa494921b8df297195fc125ebbd91a018c4066b9", sighash);

    // calc
    char* signature = nullptr;
    static const char* privkey = "cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1";
    ret = CfdCalculateEcSignature(
      handle, sighash, nullptr, privkey, kCfdNetworkRegtest, true, &signature);
    EXPECT_EQ(kCfdSuccess, ret);

    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c2131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea", signature);
      ret = CfdAddConfidentialTxDerSign(
        handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        true, signature, kCfdSigHashAll, false, false, &tx_string);
      EXPECT_EQ(kCfdSuccess, ret);
      CfdFreeStringBuffer(signature);
    }

    if (ret == kCfdSuccess) {
      ret = CfdAddConfidentialTxSign(
        handle, tx_string, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        true, "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", false, &tx_string2);
      EXPECT_EQ(kCfdSuccess, ret);
    }
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000", tx_string2);

      uint32_t count = 0;
      ret = CfdGetConfidentialTxInWitnessCount(handle, tx_string2, 0, &count);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(2, count);

      char* stack = nullptr;
      ret = CfdGetConfidentialTxInWitness(handle, tx_string2, 0, 1, &stack);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6", stack);
      if (ret == kCfdSuccess) {
        CfdFreeStringBuffer(stack);
      }

      CfdFreeStringBuffer(tx_string2);
    }

    CfdFreeStringBuffer(sighash);
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}